

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap256.h
# Opt level: O2

int __thiscall re2::Bitmap256::FindNextSetBit(Bitmap256 *this,int c)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar3 = c / 0x40;
  bVar2 = (byte)(c % 0x40);
  uVar5 = (this->words_[iVar3] >> (bVar2 & 0x3f)) << (bVar2 & 0x3f);
  if (uVar5 == 0) {
    uVar4 = 0xffffffff;
    if (iVar3 != 2) {
      if (iVar3 != 1) {
        if (iVar3 != 0) {
          return -1;
        }
        uVar5 = this->words_[1];
        if (uVar5 != 0) {
          lVar1 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          return (uint)lVar1 | 0x40;
        }
      }
      uVar5 = this->words_[2];
      if (uVar5 != 0) {
        lVar1 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        return (uint)lVar1 | 0x80;
      }
    }
    uVar5 = this->words_[3];
    if (uVar5 != 0) {
      lVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      return (uint)lVar1 | 0xc0;
    }
  }
  else {
    lVar1 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar4 = (uint)lVar1 | iVar3 << 6;
  }
  return uVar4;
}

Assistant:

int Bitmap256::FindNextSetBit(int c) const {
  DCHECK_GE(c, 0);
  DCHECK_LE(c, 255);

  // Check the word that contains the bit. Mask out any lower bits.
  int i = c / 64;
  uint64_t word = words_[i] & (~0ULL << (c % 64));
  if (word != 0)
    return (i * 64) + FindLSBSet(word);

  // Check any following words.
  i++;
  switch (i) {
    case 1:
      if (words_[1] != 0)
        return (1 * 64) + FindLSBSet(words_[1]);
      FALLTHROUGH_INTENDED;
    case 2:
      if (words_[2] != 0)
        return (2 * 64) + FindLSBSet(words_[2]);
      FALLTHROUGH_INTENDED;
    case 3:
      if (words_[3] != 0)
        return (3 * 64) + FindLSBSet(words_[3]);
      FALLTHROUGH_INTENDED;
    default:
      return -1;
  }
}